

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O1

BasicValue *
cvm::Ncurses::NoEcho
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *param_1)

{
  int iVar1;
  
  iVar1 = noecho();
  __return_storage_ptr__->Type = IntType;
  (__return_storage_ptr__->StrVal)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->StrVal).field_2;
  (__return_storage_ptr__->StrVal)._M_string_length = 0;
  (__return_storage_ptr__->StrVal).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->field_2).IntVal = iVar1;
  (__return_storage_ptr__->ArrayPtr).
  super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->ArrayPtr).
  super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

BasicValue Ncurses::NoEcho(std::list<BasicValue> &/*Args*/) {
  return ::noecho();
}